

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O1

string * __thiscall
program_options::invalid_syntax::get_template_abi_cxx11_
          (string *__return_storage_ptr__,invalid_syntax *this,kind_t kind)

{
  size_t sVar1;
  char *__s;
  
  if (kind - long_not_allowed < 7) {
    __s = &DAT_0015a9b4 + *(int *)(&DAT_0015a9b4 + (ulong)(kind - long_not_allowed) * 4);
  }
  else {
    __s = "unknown command line syntax error for \'%s\'";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,__s + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string invalid_syntax::get_template(kind_t kind)
{
    // Initially, store the message in 'const char*' variable,
    // to avoid conversion to string in all cases.
    const char* msg;
    switch(kind)
    {
    case empty_adjacent_parameter:
        msg = "the argument for option '%canonical_option%' should follow immediately after the equal sign";
        break;
    case missing_parameter:
        msg = "the required argument for option '%canonical_option%' is missing";
        break;
    case unrecognized_line:
        msg = "the options configuration file contains an invalid line '%invalid_line%'";
        break;
    // none of the following are currently used:
    case long_not_allowed:
        msg = "the unabbreviated option '%canonical_option%' is not valid";
        break;
    case long_adjacent_not_allowed:
        msg = "the unabbreviated option '%canonical_option%' does not take any arguments";
        break;
    case short_adjacent_not_allowed:
        msg = "the abbreviated option '%canonical_option%' does not take any arguments";
        break;
    case extra_parameter:
        msg = "option '%canonical_option%' does not take any arguments";
        break;
    default:
        msg = "unknown command line syntax error for '%s'";
    }
    return msg;
}